

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SendBuffer.h
# Opt level: O1

void __thiscall SendBuffer::SendBuffer(SendBuffer *this,int size)

{
  long *local_40 [2];
  long local_30 [2];
  
  (this->buf)._M_dataplus._M_p = (pointer)&(this->buf).field_2;
  (this->buf)._M_string_length = 0;
  (this->buf).field_2._M_local_buf[0] = '\0';
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)size);
  std::__cxx11::string::operator=((string *)this,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  this->full = 0;
  this->read = 0;
  return;
}

Assistant:

SendBuffer(int size) {
    this->buf = std::string(size, '\0');
    full = 0;
    read = 0;
  }